

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_address.cpp
# Opt level: O0

bool __thiscall
zmq::tcp_address_mask_t::match_address(tcp_address_mask_t *this,sockaddr *ss_,socklen_t ss_len_)

{
  byte bVar1;
  int iVar2;
  size_t __n;
  uint in_EDX;
  short *in_RSI;
  short *in_RDI;
  bool bVar3;
  uint8_t last_byte_bits;
  size_t full_bytes;
  uint8_t *their_bytes;
  uint8_t *our_bytes;
  int mask;
  short *local_30;
  short *local_28;
  int local_20;
  
  bVar3 = false;
  if ((*(int *)(in_RDI + 0xe) != -1) && (bVar3 = false, in_RSI != (short *)0x0)) {
    bVar3 = 0xf < in_EDX;
  }
  if (!bVar3) {
    fprintf(_stderr,"Assertion failed: %s (%s:%d)\n",
            "_address_mask != -1 && ss_ != NULL && ss_len_ >= static_cast<socklen_t> (sizeof (struct sockaddr))"
            ,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_address.cpp"
            ,0x10b);
    fflush(_stderr);
    zmq_abort((char *)0x2dea1a);
  }
  if (*in_RSI != *in_RDI) {
    return false;
  }
  if (0 < *(int *)(in_RDI + 0xe)) {
    if (*in_RSI == 10) {
      if (in_EDX != 0x1c) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ss_len_ == sizeof (struct sockaddr_in6)",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_address.cpp"
                ,0x114);
        fflush(_stderr);
        zmq_abort((char *)0x2deab6);
      }
      local_30 = in_RSI + 4;
      local_28 = in_RDI + 4;
      local_20 = 0x80;
    }
    else {
      if (in_EDX != 0x10) {
        fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","ss_len_ == sizeof (struct sockaddr_in)",
                "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/tcp_address.cpp"
                ,0x11c);
        fflush(_stderr);
        zmq_abort((char *)0x2deb3d);
      }
      local_30 = in_RSI + 2;
      local_28 = in_RDI + 2;
      local_20 = 0x20;
    }
    if (*(int *)(in_RDI + 0xe) < local_20) {
      local_20 = *(int *)(in_RDI + 0xe);
    }
    __n = (size_t)(local_20 / 8);
    iVar2 = memcmp(local_28,local_30,__n);
    if (iVar2 != 0) {
      return false;
    }
    bVar1 = (byte)(0xff << (8U - (char)(local_20 % 8) & 0x1f));
    if ((bVar1 != 0) &&
       ((*(byte *)((long)local_30 + __n) & bVar1) != (*(byte *)((long)local_28 + __n) & bVar1))) {
      return false;
    }
  }
  return true;
}

Assistant:

bool zmq::tcp_address_mask_t::match_address (const struct sockaddr *ss_,
                                             const socklen_t ss_len_) const
{
    zmq_assert (_address_mask != -1 && ss_ != NULL
                && ss_len_
                     >= static_cast<socklen_t> (sizeof (struct sockaddr)));

    if (ss_->sa_family != _network_address.generic.sa_family)
        return false;

    if (_address_mask > 0) {
        int mask;
        const uint8_t *our_bytes, *their_bytes;
        if (ss_->sa_family == AF_INET6) {
            zmq_assert (ss_len_ == sizeof (struct sockaddr_in6));
            their_bytes = reinterpret_cast<const uint8_t *> (
              &((reinterpret_cast<const struct sockaddr_in6 *> (ss_))
                  ->sin6_addr));
            our_bytes = reinterpret_cast<const uint8_t *> (
              &_network_address.ipv6.sin6_addr);
            mask = sizeof (struct in6_addr) * 8;
        } else {
            zmq_assert (ss_len_ == sizeof (struct sockaddr_in));
            their_bytes = reinterpret_cast<const uint8_t *> (&(
              (reinterpret_cast<const struct sockaddr_in *> (ss_))->sin_addr));
            our_bytes = reinterpret_cast<const uint8_t *> (
              &_network_address.ipv4.sin_addr);
            mask = sizeof (struct in_addr) * 8;
        }
        if (_address_mask < mask)
            mask = _address_mask;

        const size_t full_bytes = mask / 8;
        if (memcmp (our_bytes, their_bytes, full_bytes) != 0)
            return false;

        const uint8_t last_byte_bits = 0xffU << (8 - mask % 8);
        if (last_byte_bits) {
            if ((their_bytes[full_bytes] & last_byte_bits)
                != (our_bytes[full_bytes] & last_byte_bits))
                return false;
        }
    }

    return true;
}